

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_type __thiscall
phmap::container_internal::
parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::erase<unsigned_long>
          (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *this,key_arg<unsigned_long> *key)

{
  bool bVar1;
  size_t __n;
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_00;
  DoNothing local_69;
  undefined1 auStack_68 [7];
  UpgradeToUnique unique;
  undefined1 local_58 [8];
  iterator it;
  UpgradeLock m;
  EmbeddedSet *set;
  Inner *inner;
  size_t local_28;
  size_t hashval;
  key_arg<unsigned_long> *key_local;
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_local;
  
  hashval = (size_t)key;
  key_local = (key_arg<unsigned_long> *)this;
  inner = (Inner *)hash_ref(this);
  local_28 = parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
             ::HashElement::operator()((HashElement *)&inner,(unsigned_long *)hashval);
  __n = subidx(local_28);
  this_00 = &std::
             array<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>::Inner,_16UL>
             ::operator[](&this->sets_,__n)->set_;
  LockableBaseImpl<phmap::NullMutex>::DoNothing::
  DoNothing<phmap::container_internal::parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>::Inner&>
            ((DoNothing *)((long)&it.field_1 + 7),(Inner *)this_00);
  _local_58 = raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
              ::find<unsigned_long>(this_00,(key_arg<unsigned_long> *)hashval,local_28);
  _auStack_68 = raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                ::end(this_00);
  bVar1 = container_internal::operator==((iterator *)local_58,(iterator *)auStack_68);
  if (!bVar1) {
    LockableBaseImpl<phmap::NullMutex>::DoNothing::
    DoNothing<phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing&>
              (&local_69,(DoNothing *)((long)&it.field_1 + 7));
    raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
    ::_erase(this_00,_local_58);
  }
  this_local = (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                *)(ulong)!bVar1;
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto hashval = HashElement{hash_ref()}(key);
        Inner& inner = sets_[subidx(hashval)];
        auto&  set   = inner.set_;
        typename Lockable::UpgradeLock m(inner);
        auto it   = set.find(key, hashval);
        if (it == set.end()) 
            return 0;

        typename Lockable::UpgradeToUnique unique(m);
        set._erase(it);
        return 1;
    }